

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O1

int __thiscall JetHead::File::open(File *this,char *__file,int __oflag,...)

{
  int iVar1;
  ErrCode EVar2;
  int *piVar3;
  uint uVar4;
  
  this->mOpenFlags = __oflag;
  uVar4 = 2;
  if (((~__oflag & 3U) != 0) && (uVar4 = 0, (__oflag & 1U) == 0)) {
    uVar4 = (uint)__oflag >> 1 & 1;
  }
  if ((__oflag & 2U) != 0) {
    if ((__oflag & 4U) == 0) {
      uVar4 = uVar4 | (__oflag & 8U) << 7;
    }
    else {
      uVar4 = uVar4 | 0x200;
    }
  }
  uVar4 = (__oflag & 0x20U) << 9 | uVar4;
  if ((__oflag & 0x10U) == 0) {
    iVar1 = ::open(__file,uVar4);
  }
  else {
    iVar1 = ::open(__file,uVar4 | 0x40,0x1b6);
  }
  this->mFd = iVar1;
  if (iVar1 != -1) {
    return 0;
  }
  piVar3 = __errno_location();
  EVar2 = getErrorCode(*piVar3);
  return EVar2;
}

Assistant:

JetHead::ErrCode File::open( const char *name, int flags )
{
	int sys_flags = 0;

	TRACE_BEGIN( LOG_LVL_INFO );

	LOG( "Flags %x", flags );

	mOpenFlags = flags;

	if ( ( flags & OF_RDWR ) == OF_RDWR )
		sys_flags |= O_RDWR;
	else if ( flags & OF_READ )
		sys_flags |= O_RDONLY;
	else if ( flags & OF_WRITE )
		sys_flags |= O_WRONLY;
	else
		sys_flags |= O_RDONLY;

	// trunc and append only effect write operations.  We'll ignore if not
	//  opening for write.  Since rumor has it some platforms will do strange
	//  things when you open read only with these flags.
	if ( flags & OF_WRITE )
	{
		// if both trunc and append are set, we'll trunc.
		if ( flags & OF_TRUNC )
			sys_flags |= O_TRUNC;
		else if ( flags & OF_APPEND )
			sys_flags |= O_APPEND;
	}

#ifndef PLATFORM_DARWIN
	// This is a Linux specific construct that we support on those systems.
	//  if O_DIRECT is not passed, all calling code should still work on the
	//  non-Linux platform.
	if ( flags & OF_ODIRECT )
		sys_flags |= O_DIRECT;
#endif

	LOG( "sys_flags %x", sys_flags );

	if ( flags & OF_CREATE )
	{
		LOG( "Create" );
		sys_flags |= O_CREAT;
		mFd = ::open( name, sys_flags, 0666 );
	}
	else
		mFd = ::open( name, sys_flags );

	if (mFd == -1)
	{
		return getErrorCode( errno );
	}

	return JetHead::kNoError;
}